

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<ProKey,_ProKey>_>::rehash
          (Data<QHashPrivate::Node<ProKey,_ProKey>_> *this,size_t sizeHint)

{
  ProString *str;
  ulong uVar1;
  Span *pSVar2;
  Entry *pEVar3;
  ulong uVar4;
  Node<ProKey,_ProKey> *this_00;
  ulong uVar5;
  size_t index;
  long lVar6;
  size_t sVar7;
  ulong uVar8;
  long lVar9;
  R RVar10;
  Bucket BVar11;
  Span *local_48;
  
  if (sizeHint == 0) {
    sizeHint = this->size;
  }
  sVar7 = 0x80;
  if ((0x40 < sizeHint) && (sVar7 = 0xffffffffffffffff, sizeHint >> 0x3e == 0)) {
    lVar6 = 0x3f;
    if (sizeHint != 0) {
      for (; sizeHint >> lVar6 == 0; lVar6 = lVar6 + -1) {
      }
    }
    sVar7 = 1L << (0x41 - ((byte)lVar6 ^ 0x3f) & 0x3f);
  }
  uVar1 = this->numBuckets;
  pSVar2 = this->spans;
  RVar10 = allocateSpans(sVar7);
  this->spans = (Span *)RVar10.spans;
  this->numBuckets = sVar7;
  if (0x7f < uVar1) {
    uVar5 = 0;
    local_48 = pSVar2;
    do {
      lVar6 = 0;
      do {
        if (local_48->offsets[lVar6] != 0xff) {
          pEVar3 = pSVar2[uVar5].entries;
          uVar8 = (ulong)((uint)local_48->offsets[lVar6] * 0x60);
          str = (ProString *)((pEVar3->storage).data + uVar8);
          uVar4 = this->seed;
          sVar7 = qHash(str);
          BVar11 = findBucketWithHash<ProKey>(this,(ProKey *)str,uVar4 ^ sVar7);
          this_00 = Span<QHashPrivate::Node<ProKey,_ProKey>_>::insert(BVar11.span,BVar11.index);
          ProString::ProString((ProString *)this_00,str);
          ProString::ProString
                    (&(this_00->value).super_ProString,
                     (ProString *)((pEVar3->storage).data + uVar8 + 0x30));
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0x80);
      Span<QHashPrivate::Node<ProKey,_ProKey>_>::freeData(pSVar2 + uVar5);
      uVar5 = uVar5 + 1;
      local_48 = local_48 + 1;
    } while (uVar5 != uVar1 >> 7);
  }
  if (pSVar2 != (Span *)0x0) {
    lVar6 = *(long *)&pSVar2[-1].allocated;
    if (lVar6 != 0) {
      lVar9 = lVar6 * 0x90;
      do {
        Span<QHashPrivate::Node<ProKey,_ProKey>_>::freeData
                  ((Span<QHashPrivate::Node<ProKey,_ProKey>_> *)(pSVar2[-1].offsets + lVar9));
        lVar9 = lVar9 + -0x90;
      } while (lVar9 != 0);
    }
    operator_delete__(&pSVar2[-1].allocated,lVar6 * 0x90 + 8);
    return;
  }
  return;
}

Assistant:

void rehash(size_t sizeHint = 0)
    {
        if (sizeHint == 0)
            sizeHint = size;
        size_t newBucketCount = GrowthPolicy::bucketsForCapacity(sizeHint);

        Span *oldSpans = spans;
        size_t oldBucketCount = numBuckets;
        spans = allocateSpans(newBucketCount).spans;
        numBuckets = newBucketCount;
        size_t oldNSpans = oldBucketCount >> SpanConstants::SpanShift;

        for (size_t s = 0; s < oldNSpans; ++s) {
            Span &span = oldSpans[s];
            for (size_t index = 0; index < SpanConstants::NEntries; ++index) {
                if (!span.hasNode(index))
                    continue;
                Node &n = span.at(index);
                auto it = findBucket(n.key);
                Q_ASSERT(it.isUnused());
                Node *newNode = it.insert();
                new (newNode) Node(std::move(n));
            }
            span.freeData();
        }
        delete[] oldSpans;
    }